

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::java::ToJavaName
                   (string *__return_storage_ptr__,string *full_name,FileDescriptor *file)

{
  FileDescriptor *pFVar1;
  bool bVar2;
  FileOptions *this;
  ulong uVar3;
  undefined1 in_CL;
  FileDescriptor *descriptor;
  string local_98 [32];
  string local_78;
  string local_58;
  undefined1 local_21;
  FileDescriptor *local_20;
  FileDescriptor *file_local;
  string *full_name_local;
  string *result;
  
  local_21 = 0;
  local_20 = file;
  file_local = (FileDescriptor *)full_name;
  full_name_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  this = FileDescriptor::options(local_20);
  bVar2 = FileOptions::java_multiple_files(this);
  if (bVar2) {
    FileJavaPackage_abi_cxx11_(&local_58,(java *)local_20,(FileDescriptor *)0x1,(bool)in_CL);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    ClassName_abi_cxx11_(&local_78,(java *)local_20,descriptor);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'.');
  }
  FileDescriptor::package_abi_cxx11_(local_20);
  uVar3 = std::__cxx11::string::empty();
  pFVar1 = file_local;
  if ((uVar3 & 1) == 0) {
    FileDescriptor::package_abi_cxx11_(local_20);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_98,(ulong)pFVar1);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_98);
    std::__cxx11::string::~string(local_98);
  }
  else {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)file_local);
  }
  return __return_storage_ptr__;
}

Assistant:

string ToJavaName(const string& full_name,
                  const FileDescriptor* file) {
  string result;
  if (file->options().java_multiple_files()) {
    result = FileJavaPackage(file);
  } else {
    result = ClassName(file);
  }
  if (!result.empty()) {
    result += '.';
  }
  if (file->package().empty()) {
    result += full_name;
  } else {
    // Strip the proto package from full_name since we've replaced it with
    // the Java package.
    result += full_name.substr(file->package().size() + 1);
  }
  return result;
}